

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_progress(nk_command_buffer *out,nk_flags state,nk_style_progress *style,nk_rect *bounds
                     ,nk_rect *scursor,nk_size value,nk_size max)

{
  nk_style_item *local_48;
  nk_style_item *cursor;
  nk_style_item *background;
  nk_size value_local;
  nk_rect *scursor_local;
  nk_rect *bounds_local;
  nk_style_progress *style_local;
  nk_flags state_local;
  nk_command_buffer *out_local;
  
  if ((state & 0x20) == 0) {
    if ((state & 0x10) == 0) {
      local_48 = &style->cursor_normal;
      cursor = &style->normal;
    }
    else {
      cursor = &style->hover;
      local_48 = &style->cursor_hover;
    }
  }
  else {
    cursor = &style->active;
    local_48 = &style->cursor_active;
  }
  if (cursor->type == NK_STYLE_ITEM_COLOR) {
    nk_fill_rect(out,*bounds,style->rounding,(cursor->data).color);
    nk_stroke_rect(out,*bounds,style->rounding,style->border,style->border_color);
  }
  else {
    nk_draw_image(out,*bounds,&(cursor->data).image,(nk_color)0xffffffff);
  }
  if (local_48->type == NK_STYLE_ITEM_COLOR) {
    nk_fill_rect(out,*scursor,style->rounding,(local_48->data).color);
    nk_stroke_rect(out,*scursor,style->rounding,style->border,style->border_color);
  }
  else {
    nk_draw_image(out,*scursor,&(local_48->data).image,(nk_color)0xffffffff);
  }
  return;
}

Assistant:

NK_LIB void
nk_draw_progress(struct nk_command_buffer *out, nk_flags state,
    const struct nk_style_progress *style, const struct nk_rect *bounds,
    const struct nk_rect *scursor, nk_size value, nk_size max)
{
    const struct nk_style_item *background;
    const struct nk_style_item *cursor;

    NK_UNUSED(max);
    NK_UNUSED(value);

    /* select correct colors/images to draw */
    if (state & NK_WIDGET_STATE_ACTIVED) {
        background = &style->active;
        cursor = &style->cursor_active;
    } else if (state & NK_WIDGET_STATE_HOVER){
        background = &style->hover;
        cursor = &style->cursor_hover;
    } else {
        background = &style->normal;
        cursor = &style->cursor_normal;
    }

    /* draw background */
    if (background->type == NK_STYLE_ITEM_COLOR) {
        nk_fill_rect(out, *bounds, style->rounding, background->data.color);
        nk_stroke_rect(out, *bounds, style->rounding, style->border, style->border_color);
    } else nk_draw_image(out, *bounds, &background->data.image, nk_white);

    /* draw cursor */
    if (cursor->type == NK_STYLE_ITEM_COLOR) {
        nk_fill_rect(out, *scursor, style->rounding, cursor->data.color);
        nk_stroke_rect(out, *scursor, style->rounding, style->border, style->border_color);
    } else nk_draw_image(out, *scursor, &cursor->data.image, nk_white);
}